

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::CPrimitiveMode::
IsGeometryShaderSupported<glcts::(anonymous_namespace)::test_api::GL>(CPrimitiveMode *this)

{
  bool bVar1;
  RenderContext *pRVar2;
  allocator<char> local_61;
  string local_60;
  ApiType local_3c;
  ContextType local_38;
  ApiType local_34;
  ContextType local_30;
  deUint32 local_2c;
  deUint32 *local_28;
  ContextType *type;
  ContextInfo *info;
  CPrimitiveMode *this_local;
  
  info = (ContextInfo *)this;
  bVar1 = test_api::GL::isES();
  if (bVar1) {
    type = (ContextType *)
           deqp::Context::getContextInfo
                     ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context);
    pRVar2 = deqp::Context::getRenderContext
                       ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context);
    local_30.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
    local_28 = &local_2c;
    local_2c = (deUint32)local_30.super_ApiType.m_bits;
    glu::ApiType::ApiType(&local_34,3,2,PROFILE_ES);
    bVar1 = glu::contextSupports(local_30,local_34);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      local_38.super_ApiType.m_bits = (ApiType)*local_28;
      glu::ApiType::ApiType(&local_3c,3,1,PROFILE_ES);
      bVar1 = glu::contextSupports(local_38,local_3c);
      if ((bVar1) &&
         ((bVar1 = glu::ContextInfo::isExtensionSupported
                             ((ContextInfo *)type,"GL_EXT_geometry_shader"), bVar1 ||
          (bVar1 = glu::ContextInfo::isExtensionSupported
                             ((ContextInfo *)type,"GL_OES_geometry_shader"), bVar1)))) {
        this_local._7_1_ = true;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"Geometry shader is not supported\n",&local_61);
        deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IsGeometryShaderSupported()
	{
		if (api::isES())
		{
			const glu::ContextInfo& info = m_context.getContextInfo();
			const glu::ContextType& type = m_context.getRenderContext().getType();

			/* ES 3.2+ included geometry shaders into the core */
			if (glu::contextSupports(type, glu::ApiType(3, 2, glu::PROFILE_ES)))
			{
				return true;
			}
			/* ES 3.1 may be able to support geometry shaders via extensions */
			else if ((glu::contextSupports(type, glu::ApiType(3, 1, glu::PROFILE_ES))) &&
					 ((true == info.isExtensionSupported("GL_EXT_geometry_shader")) ||
					  (true == info.isExtensionSupported("GL_OES_geometry_shader"))))
			{
				return true;
			}
			else
			{
				OutputNotSupported("Geometry shader is not supported\n");
				return false;
			}
		}
		else
		{
			return true;
		}
	}